

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv_udp_set_multicast_interface(uv_udp_t *handle,char *interface_addr)

{
  int iVar1;
  int *piVar2;
  sockaddr_in6 *addr6;
  sockaddr_in *addr4;
  sockaddr_storage addr_st;
  char *interface_addr_local;
  uv_udp_t *handle_local;
  
  addr_st.__ss_align = (unsigned_long)interface_addr;
  if (interface_addr == (char *)0x0) {
    memset(&addr4,0,0x80);
    if ((handle->flags & 0x400000) == 0) {
      addr4._0_2_ = 2;
      addr4._4_4_ = htonl(0);
    }
    else {
      addr4._0_2_ = 10;
      addr_st.__ss_padding[0xe] = '\0';
      addr_st.__ss_padding[0xf] = '\0';
      addr_st.__ss_padding[0x10] = '\0';
      addr_st.__ss_padding[0x11] = '\0';
    }
  }
  else {
    iVar1 = uv_ip4_addr(interface_addr,0,(sockaddr_in *)&addr4);
    if ((iVar1 != 0) &&
       (iVar1 = uv_ip6_addr((char *)addr_st.__ss_align,0,(sockaddr_in6 *)&addr4), iVar1 != 0)) {
      return -0x16;
    }
  }
  if ((short)addr4 == 2) {
    iVar1 = setsockopt((handle->io_watcher).fd,0,0x20,(void *)((long)&addr4 + 4),4);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
  }
  else {
    if ((short)addr4 != 10) {
      __assert_fail("0 && \"unexpected address family\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/udp.c"
                    ,0x519,"int uv_udp_set_multicast_interface(uv_udp_t *, const char *)");
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0x29,0x11,addr_st.__ss_padding + 0xe,4);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
  }
  return 0;
}

Assistant:

int uv_udp_set_multicast_interface(uv_udp_t* handle, const char* interface_addr) {
  struct sockaddr_storage addr_st;
  struct sockaddr_in* addr4;
  struct sockaddr_in6* addr6;

  addr4 = (struct sockaddr_in*) &addr_st;
  addr6 = (struct sockaddr_in6*) &addr_st;

  if (!interface_addr) {
    memset(&addr_st, 0, sizeof addr_st);
    if (handle->flags & UV_HANDLE_IPV6) {
      addr_st.ss_family = AF_INET6;
      addr6->sin6_scope_id = 0;
    } else {
      addr_st.ss_family = AF_INET;
      addr4->sin_addr.s_addr = htonl(INADDR_ANY);
    }
  } else if (uv_ip4_addr(interface_addr, 0, addr4) == 0) {
    /* nothing, address was parsed */
  } else if (uv_ip6_addr(interface_addr, 0, addr6) == 0) {
    /* nothing, address was parsed */
  } else {
    return UV_EINVAL;
  }

  if (addr_st.ss_family == AF_INET) {
    if (setsockopt(handle->io_watcher.fd,
                   IPPROTO_IP,
                   IP_MULTICAST_IF,
                   (void*) &addr4->sin_addr,
                   sizeof(addr4->sin_addr)) == -1) {
      return UV__ERR(errno);
    }
  } else if (addr_st.ss_family == AF_INET6) {
    if (setsockopt(handle->io_watcher.fd,
                   IPPROTO_IPV6,
                   IPV6_MULTICAST_IF,
                   &addr6->sin6_scope_id,
                   sizeof(addr6->sin6_scope_id)) == -1) {
      return UV__ERR(errno);
    }
  } else {
    assert(0 && "unexpected address family");
    abort();
  }

  return 0;
}